

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

void print_scope(D_Scope *st)

{
  D_Sym *local_20;
  D_Sym *ll;
  uint i;
  D_Scope *st_local;
  
  printf("SCOPE %p: ",st);
  printf("  owned: %d, kind: %d, ",(ulong)(*(byte *)st >> 2 & 1),(ulong)(*(byte *)st & 3));
  if (st->ll != (D_Sym *)0x0) {
    printf("  LL\n");
  }
  if (st->hash != (D_SymHash *)0x0) {
    printf("  HASH\n");
  }
  if (st->hash == (D_SymHash *)0x0) {
    for (local_20 = st->ll; local_20 != (D_Sym *)0x0; local_20 = local_20->next) {
      print_sym(local_20);
    }
  }
  else {
    for (ll._4_4_ = 0; ll._4_4_ < (st->hash->syms).n; ll._4_4_ = ll._4_4_ + 1) {
      if ((st->hash->syms).v[ll._4_4_] != (D_Sym *)0x0) {
        print_sym((st->hash->syms).v[ll._4_4_]);
      }
    }
  }
  printf("\n\n");
  if (st->dynamic != (D_Scope *)0x0) {
    print_scope(st->dynamic);
  }
  if (st->search != (D_Scope *)0x0) {
    print_scope(st->search);
  }
  return;
}

Assistant:

void print_scope(D_Scope *st) {
  printf("SCOPE %p: ", (void *)st);
  printf("  owned: %d, kind: %d, ", st->owned_by_user, st->kind);
  if (st->ll) printf("  LL\n");
  if (st->hash) printf("  HASH\n");
  if (st->hash) {
    uint i;
    for (i = 0; i < st->hash->syms.n; i++)
      if (st->hash->syms.v[i]) print_sym(st->hash->syms.v[i]);
  } else {
    D_Sym *ll = st->ll;
    while (ll) {
      print_sym(ll);
      ll = ll->next;
    }
  }
  printf("\n\n");
  if (st->dynamic) print_scope(st->dynamic);
  if (st->search) print_scope(st->search);
}